

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O0

bool __thiscall DIntermissionScreen::CheckOverlay(DIntermissionScreen *this,int i)

{
  bool bVar1;
  FIIntermissionPatch *pFVar2;
  FName local_2c;
  PClass *local_28;
  PClass *cls;
  DIntermissionScreen *pDStack_18;
  int i_local;
  DIntermissionScreen *this_local;
  
  cls._4_4_ = i;
  pDStack_18 = this;
  pFVar2 = TArray<FIIntermissionPatch,_FIIntermissionPatch>::operator[](&this->mOverlays,(long)i);
  bVar1 = FName::operator==(&pFVar2->mCondition,NAME_Multiplayer);
  if ((bVar1) && ((multiplayer & 1U) == 0)) {
    return false;
  }
  pFVar2 = TArray<FIIntermissionPatch,_FIIntermissionPatch>::operator[]
                     (&this->mOverlays,(long)cls._4_4_);
  bVar1 = FName::operator!=(&pFVar2->mCondition,NAME_None);
  if (bVar1) {
    if (((multiplayer & 1U) != 0) || (players == (DObject *)0x0)) {
      return false;
    }
    pFVar2 = TArray<FIIntermissionPatch,_FIIntermissionPatch>::operator[]
                       (&this->mOverlays,(long)cls._4_4_);
    FName::FName(&local_2c,&pFVar2->mCondition);
    local_28 = PClass::FindClass(&local_2c);
    if (local_28 == (PClass *)0x0) {
      return false;
    }
    bVar1 = DObject::IsKindOf(players,local_28);
    if (!bVar1) {
      return false;
    }
  }
  return true;
}

Assistant:

bool DIntermissionScreen::CheckOverlay(int i)
{
	if (mOverlays[i].mCondition == NAME_Multiplayer && !multiplayer) return false;
	else if (mOverlays[i].mCondition != NAME_None)
	{
		if (multiplayer || players[0].mo == NULL) return false;
		const PClass *cls = PClass::FindClass(mOverlays[i].mCondition);
		if (cls == NULL) return false;
		if (!players[0].mo->IsKindOf(cls)) return false;
	}
	return true;
}